

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# der.c
# Opt level: O0

size_t derTDec(u32 *tag,octet *der,size_t count)

{
  byte *pbVar1;
  size_t sVar2;
  ulong local_40;
  size_t pos;
  size_t t_count;
  u32 t;
  size_t count_local;
  octet *der_local;
  u32 *tag_local;
  
  t_count = 1;
  if (count == 0) {
    return 0xffffffffffffffff;
  }
  local_40 = count;
  if (4 < count) {
    local_40 = 4;
  }
  if ((*der & 0x1f) == 0x1f) {
    if ((local_40 < 2) || ((der[1] & 0x7f) == 0)) {
      return 0;
    }
    t = 0;
    do {
      if (local_40 <= t_count) break;
      t = der[t_count] & 0x7f | t << 8;
      sVar2 = t_count + 1;
      pbVar1 = der + t_count;
      t_count = sVar2;
    } while ((*pbVar1 & 0x80) != 0);
    if ((t_count == local_40) || (t < 0x1f)) {
      return 0xffffffffffffffff;
    }
  }
  else if (*der == '\0') {
    return 0xffffffffffffffff;
  }
  if (tag != (u32 *)0x0) {
    t = (u32)*der;
    for (pos = 1; pos < t_count; pos = pos + 1) {
      t = (uint)der[pos] | t << 8;
    }
    *tag = t;
  }
  return t_count;
}

Assistant:

static size_t derTDec(u32* tag, const octet der[], size_t count)
{
	u32 t;
	size_t t_count = 1;
	// обработать длину кода
	if (count < 1)
		return SIZE_MAX;
	ASSERT(memIsValid(der, count));
	count = MIN2(4, count);
	// длинный код?
	if ((der[0] & 31) == 31)
	{
		// короткий код? лишний октет с нулем?
		if (count < 2 || (der[1] & 127) == 0)
			return FALSE;
		for (t = 0; t_count < count;)
		{
			t <<= 8, t |= der[t_count] & 127;
			// завершающий октет?
			if ((der[t_count++] & 128) == 0)
				break;
		}
		// завершающий октет не найден?
		// можно было обойтись коротким кодом?
		if (t_count == count || t < 31)
			return SIZE_MAX;
	}
	// нулевой тег?
	else if (der[0] == 0)
		return SIZE_MAX;
	// возврат 
	if (tag)
	{
		size_t pos;
		ASSERT(memIsValid(tag, 4));
		for (t = der[0], pos = 1; pos < t_count; ++pos)
			t <<= 8, t |= der[pos];
		*tag = t;		
	}
	return t_count;
}